

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_luma_subsampling_420_lbd_c
               (uint8_t *input,int input_stride,uint16_t *output_q3,int width,int height)

{
  int iVar1;
  long lVar2;
  
  for (iVar1 = 0; iVar1 < height; iVar1 = iVar1 + 2) {
    for (lVar2 = 0; lVar2 < width; lVar2 = lVar2 + 2) {
      *(ushort *)((long)output_q3 + lVar2) =
           ((ushort)input[lVar2 + (long)input_stride + 1] + (ushort)input[lVar2 + input_stride] +
           (ushort)input[lVar2 + 1] + (ushort)input[lVar2]) * 2;
    }
    input = input + input_stride * 2;
    output_q3 = output_q3 + 0x20;
  }
  return;
}

Assistant:

static void cfl_luma_subsampling_420_lbd_c(const uint8_t *input,
                                           int input_stride,
                                           uint16_t *output_q3, int width,
                                           int height) {
  for (int j = 0; j < height; j += 2) {
    for (int i = 0; i < width; i += 2) {
      const int bot = i + input_stride;
      output_q3[i >> 1] =
          (input[i] + input[i + 1] + input[bot] + input[bot + 1]) << 1;
    }
    input += input_stride << 1;
    output_q3 += CFL_BUF_LINE;
  }
}